

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

void show_resolve_info(Curl_easy *data,Curl_dns_entry *dns)

{
  dynbuf *s;
  _Bool _Var1;
  CURLcode CVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  Curl_addrinfo *ai;
  dynbuf out [2];
  char buf [46];
  dynbuf adStack_a8 [2];
  char local_68 [56];
  
  if (((data->set).field_0x8bd & 0x10) != 0) {
    if (dns->hostname[0] != '\0') {
      pcVar4 = dns->hostname;
      _Var1 = Curl_host_is_ipnum(pcVar4);
      if (!_Var1) {
        ai = dns->addr;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          if (dns->hostname[0] == '\0') {
            pcVar4 = "(none)";
          }
          Curl_infof(data,"Host %s:%d was resolved.",pcVar4,(ulong)(uint)dns->hostport);
        }
        Curl_dyn_init(adStack_a8,0x400);
        Curl_dyn_init(adStack_a8 + 1,0x400);
        if (ai != (Curl_addrinfo *)0x0) {
          CVar2 = CURLE_OK;
          do {
            if ((ai->ai_family | 8U) == 10) {
              s = adStack_a8 + (ai->ai_family != 2);
              Curl_printable_address(ai,local_68,0x2e);
              sVar3 = Curl_dyn_len(s);
              if (sVar3 != 0) {
                CVar2 = Curl_dyn_addn(s,", ",2);
              }
              if (CVar2 == CURLE_OK) {
                CVar2 = Curl_dyn_add(s,local_68);
              }
              iVar5 = 0xc;
              if (CVar2 == CURLE_OK) {
                iVar5 = 0;
              }
              if (((data != (Curl_easy *)0x0) && (CVar2 != CURLE_OK)) &&
                 (iVar5 = 0xc, ((data->set).field_0x8bd & 0x10) != 0)) {
                Curl_infof(data,"too many IP, can\'t show");
              }
              if (iVar5 != 0) {
                if (iVar5 != 0xc) {
                  return;
                }
                goto LAB_00608462;
              }
            }
            ai = ai->ai_next;
          } while (ai != (Curl_addrinfo *)0x0);
        }
        if (data != (Curl_easy *)0x0) {
          if (((data->set).field_0x8bd & 0x10) != 0) {
            sVar3 = Curl_dyn_len(adStack_a8 + 1);
            if (sVar3 == 0) {
              pcVar4 = "(none)";
            }
            else {
              pcVar4 = Curl_dyn_ptr(adStack_a8 + 1);
            }
            Curl_infof(data,"IPv6: %s",pcVar4);
          }
          if (((data->set).field_0x8bd & 0x10) != 0) {
            sVar3 = Curl_dyn_len(adStack_a8);
            if (sVar3 == 0) {
              pcVar4 = "(none)";
            }
            else {
              pcVar4 = Curl_dyn_ptr(adStack_a8);
            }
            Curl_infof(data,"IPv4: %s",pcVar4);
          }
        }
LAB_00608462:
        Curl_dyn_free(adStack_a8);
        Curl_dyn_free(adStack_a8 + 1);
      }
    }
  }
  return;
}

Assistant:

static void show_resolve_info(struct Curl_easy *data,
                              struct Curl_dns_entry *dns)
{
  struct Curl_addrinfo *a;
  CURLcode result = CURLE_OK;
#ifdef CURLRES_IPV6
  struct dynbuf out[2];
#else
  struct dynbuf out[1];
#endif
  DEBUGASSERT(data);
  DEBUGASSERT(dns);

  if(!data->set.verbose ||
     /* ignore no name or numerical IP addresses */
     !dns->hostname[0] || Curl_host_is_ipnum(dns->hostname))
    return;

  a = dns->addr;

  infof(data, "Host %s:%d was resolved.",
        (dns->hostname[0] ? dns->hostname : "(none)"), dns->hostport);

  Curl_dyn_init(&out[0], 1024);
#ifdef CURLRES_IPV6
  Curl_dyn_init(&out[1], 1024);
#endif

  while(a) {
    if(
#ifdef CURLRES_IPV6
       a->ai_family == PF_INET6 ||
#endif
       a->ai_family == PF_INET) {
      char buf[MAX_IPADR_LEN];
      struct dynbuf *d = &out[(a->ai_family != PF_INET)];
      Curl_printable_address(a, buf, sizeof(buf));
      if(Curl_dyn_len(d))
        result = Curl_dyn_addn(d, ", ", 2);
      if(!result)
        result = Curl_dyn_add(d, buf);
      if(result) {
        infof(data, "too many IP, can't show");
        goto fail;
      }
    }
    a = a->ai_next;
  }

#ifdef CURLRES_IPV6
  infof(data, "IPv6: %s",
        (Curl_dyn_len(&out[1]) ? Curl_dyn_ptr(&out[1]) : "(none)"));
#endif
  infof(data, "IPv4: %s",
        (Curl_dyn_len(&out[0]) ? Curl_dyn_ptr(&out[0]) : "(none)"));

fail:
  Curl_dyn_free(&out[0]);
#ifdef CURLRES_IPV6
  Curl_dyn_free(&out[1]);
#endif
}